

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::Scrollbar(ImGuiAxis axis)

{
  ImGuiWindow *this;
  ImDrawList *this_00;
  undefined1 auVar1 [12];
  ulong uVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID IVar5;
  ImU32 IVar6;
  ImVec2 *pIVar7;
  undefined7 extraout_var;
  ImRect *pIVar8;
  char *str;
  ImGuiCol idx;
  float *pfVar9;
  uint uVar10;
  int iVar11;
  int iVar14;
  undefined1 auVar12 [12];
  int iVar15;
  int iVar16;
  undefined1 auVar13 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar32 [16];
  float fVar34;
  bool held;
  bool hovered;
  bool local_11e;
  bool local_11d;
  ImGuiID local_11c;
  undefined1 local_118 [8];
  ImVec2 IStack_110;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  ImGuiID local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar21 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  
  pIVar3 = GImGui;
  local_e8._8_8_ = local_e8._0_8_;
  local_f8._8_8_ = local_f8._0_8_;
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (axis == ImGuiAxis_X) {
    str = "#SCROLLX";
  }
  IVar5 = ImGuiWindow::GetIDNoKeepAlive(this,str,(char *)0x0);
  KeepAliveID(IVar5);
  bVar4 = (&this->ScrollbarX)[axis == ImGuiAxis_X];
  local_108._0_4_ = 0.0;
  if (bVar4 == true) {
    local_108._0_4_ = (pIVar3->Style).ScrollbarSize;
  }
  fVar17 = (this->Pos).x;
  fVar24 = (this->Pos).y;
  IStack_110.x = (this->Size).x + fVar17;
  local_78 = ZEXT416((uint)IStack_110.x);
  fVar34 = (this->Size).y + fVar24;
  fVar29 = this->WindowBorderSize;
  if (axis == ImGuiAxis_X) {
    fVar23 = fVar17 + fVar29;
    fVar28 = fVar34 - (pIVar3->Style).ScrollbarSize;
    fVar27 = 0.0;
    IStack_110.x = IStack_110.x - (float)local_108._0_4_;
    IStack_110.y = fVar34;
    fVar30 = fVar24;
  }
  else {
    fVar23 = IStack_110.x - (pIVar3->Style).ScrollbarSize;
    fVar28 = fVar24 + fVar29;
    IStack_110.y = fVar34 - (float)local_108._0_4_;
    fVar30 = 0.0;
    fVar27 = fVar24;
  }
  IStack_110.x = IStack_110.x - fVar29;
  IStack_110.y = IStack_110.y - fVar29;
  local_118._0_4_ =
       ~-(uint)(fVar23 <= fVar17) & (uint)fVar23 | (uint)fVar17 & -(uint)(fVar23 <= fVar17);
  local_118._4_4_ =
       ~-(uint)(fVar28 <= fVar24) & (uint)fVar28 | (uint)fVar24 & -(uint)(fVar28 <= fVar24);
  if (axis == ImGuiAxis_X) {
    fStack_a4 = IStack_110.y - (float)local_118._4_4_;
    if (IStack_110.x - (float)local_118._0_4_ <= 0.0) {
      return;
    }
    if (fStack_a4 <= 0.0) {
      return;
    }
    iVar11 = (uint)(bVar4 ^ 1) * 8 + 4;
    local_98._0_12_ = ZEXT812(0x3f800000);
    local_b8 = (float)CONCAT31(local_b8._1_3_,1);
    local_e8._0_8_ = 0x20;
    local_f8._0_8_ = 0x30;
  }
  else {
    fVar24 = 0.0;
    fVar17 = 0.0;
    if ((this->Flags & 1U) == 0) {
      fVar17 = (GImGui->Style).FramePadding.y;
      fVar17 = fVar17 + fVar17 + GImGui->FontBaseSize * this->FontWindowScale;
    }
    if (((uint)this->Flags >> 10 & 1) != 0) {
      fVar24 = (GImGui->Style).FramePadding.y;
      fVar24 = fVar24 + fVar24 +
               GImGui->FontBaseSize * this->FontWindowScale + (this->DC).MenuBarOffset.y;
    }
    local_118._4_4_ = (float)local_118._4_4_ + fVar17 + fVar24;
    fStack_a4 = IStack_110.y - (float)local_118._4_4_;
    if (IStack_110.x - (float)local_118._0_4_ <= 0.0) {
      return;
    }
    if (fStack_a4 <= 0.0) {
      return;
    }
    if (axis == ImGuiAxis_Y) {
      fVar17 = (pIVar3->Style).FramePadding.y;
      fVar17 = fVar17 + fVar17;
      if (fVar17 + pIVar3->FontSize <= fStack_a4) {
        local_98._0_12_ = ZEXT812(0x3f800000);
      }
      else {
        fVar17 = (fStack_a4 - pIVar3->FontSize) / fVar17;
        auVar12 = ZEXT812(0x3f800000);
        if (fVar17 <= 1.0) {
          auVar12._4_8_ = 0;
          auVar12._0_4_ = fVar17;
        }
        local_98._0_4_ = ~-(uint)(fVar17 < 0.0) & auVar12._0_4_;
        local_98._4_4_ = 0;
        local_98._8_4_ = ~(uint)fStack_a4 & auVar12._8_4_;
        if ((float)local_98._0_4_ <= 0.0) {
          return;
        }
      }
      local_b8 = (float)CONCAT31(local_b8._1_3_,1.0 <= local_98._0_4_);
    }
    else {
      local_98._0_12_ = ZEXT812(0x3f800000);
      local_b8 = (float)CONCAT31(local_b8._1_3_,1);
    }
    iVar11 = ((uint)~this->Flags >> 9 & -(this->Flags & 1U) & 2) + (uint)(bVar4 ^ 1) * 8;
    local_e8._0_8_ = 0x24;
    local_f8._0_8_ = 0x34;
  }
  local_68 = ZEXT416((uint)fVar34);
  local_98._12_4_ = 0;
  fStack_9c = (0.0 - fVar29) - (float)(~-(uint)(fVar27 <= 0.0) & (uint)fVar27);
  fStack_a0 = (0.0 - fVar29) - (float)(~-(uint)(fVar30 <= 0.0) & (uint)fVar30);
  local_a8 = IStack_110.x - (float)local_118._0_4_;
  this_00 = this->DrawList;
  local_11c = IVar5;
  local_d8 = pIVar3;
  IVar6 = GetColorU32(0xe,1.0);
  ImDrawList::AddRectFilled
            (this_00,(ImVec2 *)local_118,&IStack_110,IVar6,this->WindowRounding,iVar11);
  pIVar3 = local_d8;
  iVar11 = (int)((local_a8 + -2.0) * 0.5);
  iVar14 = (int)((fStack_a4 + -2.0) * 0.5);
  iVar15 = (int)((fStack_a0 + 0.0) * 0.0);
  iVar16 = (int)((fStack_9c + 0.0) * 0.0);
  auVar25._0_4_ = -(uint)(iVar11 < 0);
  auVar25._4_4_ = -(uint)(iVar14 < 0);
  auVar25._8_4_ = -(uint)(iVar15 < 0);
  auVar25._12_4_ = -(uint)(iVar16 < 0);
  auVar26._0_4_ = -(uint)(3 < iVar11);
  auVar26._4_4_ = -(uint)(3 < iVar14);
  auVar26._8_4_ = -(uint)(0 < iVar15);
  auVar26._12_4_ = -(uint)(0 < iVar16);
  auVar18._0_8_ = CONCAT44((float)iVar14,(float)iVar11) ^ 0x8000000080000000;
  auVar18._8_4_ = -(float)iVar15;
  auVar18._12_4_ = -(float)iVar16;
  auVar26 = auVar25 & _DAT_00173790 | ~auVar25 & (auVar26 & _DAT_00173780 | ~auVar26 & auVar18);
  fStack_d0 = auVar26._0_4_;
  fVar29 = auVar26._4_4_;
  auVar19._0_8_ = auVar26._0_8_;
  auVar19._8_4_ = fStack_d0;
  auVar19._12_4_ = fVar29;
  local_118._0_4_ = (float)local_118._0_4_ - fStack_d0;
  fVar17 = (float)local_118._4_4_ - fVar29;
  fStack_d0 = IStack_110.x + fStack_d0;
  fStack_cc = IStack_110.y + fVar29;
  auVar1._4_8_ = auVar19._8_8_;
  auVar1._0_4_ = (float)local_118._4_4_ + fVar29;
  auVar20._0_8_ = auVar1._0_8_ << 0x20;
  auVar20._8_4_ = fStack_d0;
  auVar20._12_4_ = fStack_cc;
  IStack_110 = auVar20._8_8_;
  fVar29 = (float)local_118._0_4_;
  if (axis != ImGuiAxis_X) {
    fStack_d0 = fStack_cc;
    fVar29 = fVar17;
  }
  fVar29 = fStack_d0 - fVar29;
  fVar34 = *(float *)((long)&this->Name + local_e8._0_8_) - (float)local_108._0_4_;
  fVar24 = *(float *)((long)&this->Name + local_f8._0_8_);
  _local_108 = ZEXT416((uint)fVar24);
  fVar24 = (float)(~-(uint)(fVar34 <= fVar24) & (uint)fVar34 |
                  -(uint)(fVar34 <= fVar24) & (uint)fVar24);
  local_118._4_4_ = fVar17;
  if (0.0 < fVar24) {
    pfVar9 = &(this->Scroll).y;
    pIVar7 = (ImVec2 *)pfVar9;
    if (axis == ImGuiAxis_X) {
      pIVar7 = &this->Scroll;
    }
    if (fVar24 <= 1.0) {
      fVar24 = 1.0;
    }
    fVar30 = (fVar34 / fVar24) * fVar29;
    fVar17 = (local_d8->Style).GrabMinSize;
    fVar24 = fVar29;
    if (fVar30 <= fVar29) {
      fVar24 = fVar30;
    }
    uVar10 = -(uint)(fVar30 < fVar17);
    local_e8 = ZEXT416((uint)pIVar7->x);
    local_11e = false;
    local_11d = false;
    local_bc = local_d8->ActiveId;
    local_f8 = ZEXT416((uint)fVar34);
    local_d8._0_4_ = (float)(uVar10 & (uint)fVar17 | ~uVar10 & (uint)fVar24);
    local_d8._4_4_ = fStack_cc;
    local_a8 = fVar29;
    fStack_a4 = fStack_cc;
    fStack_a0 = fStack_d0;
    fStack_9c = fStack_cc;
    bVar4 = ButtonBehavior((ImRect *)local_118,local_11c,&local_11d,&local_11e,0x2000);
    IVar5 = local_11c;
    auVar32._4_4_ = local_d8._4_4_;
    auVar32._0_4_ = (float)local_d8;
    fVar29 = 1.0;
    if (1.0 <= (float)local_108._0_4_ - (float)local_f8._0_4_) {
      fVar29 = (float)local_108._0_4_ - (float)local_f8._0_4_;
    }
    auVar32._8_4_ = local_d8._4_4_;
    auVar32._12_4_ = fStack_cc;
    auVar31._8_8_ = auVar32._8_8_;
    auVar31._4_4_ = local_e8._0_4_;
    auVar31._0_4_ = (float)local_d8;
    auVar33._0_12_ = auVar31._0_12_;
    auVar33._12_4_ = local_e8._4_4_;
    auVar13._4_4_ = fVar29;
    auVar13._0_4_ = local_a8;
    auVar13._8_4_ = fStack_a4;
    auVar13._12_4_ = 0;
    auVar26 = divps(auVar33,auVar13);
    fVar24 = auVar26._4_4_;
    iVar11 = -(uint)(auVar26._0_4_ < 1.0);
    iVar14 = -(uint)(fVar24 < 0.0);
    auVar22._4_4_ = iVar14;
    auVar22._0_4_ = iVar11;
    auVar22._8_4_ = iVar14;
    auVar22._12_4_ = iVar14;
    auVar21._8_8_ = auVar22._8_8_;
    auVar21._4_4_ = iVar11;
    auVar21._0_4_ = iVar11;
    uVar10 = movmskpd((int)CONCAT71(extraout_var,bVar4),auVar21);
    fVar17 = 0.0;
    if (((uVar10 & 2) == 0) && (fVar17 = 1.0, fVar24 <= 1.0)) {
      fVar17 = fVar24;
    }
    _local_108 = ZEXT416((uint)((fVar17 * (local_a8 - (float)local_d8)) / local_a8));
    if (((local_b8._0_1_ & (byte)uVar10) == 1) && (local_11e != false)) {
      local_88 = ZEXT416((uint)fVar29);
      fStack_b4 = fStack_a4;
      fStack_b0 = fStack_a0;
      fStack_ac = fStack_9c;
      local_f8._0_8_ = &this->Scroll;
      pIVar8 = (ImRect *)(local_118 + 4);
      if (axis == ImGuiAxis_X) {
        pIVar8 = (ImRect *)local_118;
      }
      uVar2 = (ulong)(axis != ImGuiAxis_X);
      local_58 = ZEXT416((uint)(*(float *)((pIVar3->IO).MouseDown + uVar2 * 4 + -8) -
                               (pIVar8->Min).x));
      local_e8 = auVar26;
      local_b8 = local_a8 - (float)local_d8;
      SetHoveredID(local_11c);
      fVar17 = (float)local_58._0_4_ / local_a8;
      fVar29 = 1.0;
      if (fVar17 <= 1.0) {
        fVar29 = fVar17;
      }
      fVar29 = (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar29);
      if (local_bc == IVar5) {
        fVar17 = (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2];
        bVar4 = false;
      }
      else if ((fVar29 < (float)local_108._0_4_) ||
              ((float)local_e8._0_4_ + (float)local_108._0_4_ < fVar29)) {
        (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2] = 0.0;
        bVar4 = true;
        fVar17 = 0.0;
      }
      else {
        fVar17 = (float)local_e8._0_4_ * -0.5 + (fVar29 - (float)local_108._0_4_);
        (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2] = fVar17;
        bVar4 = false;
      }
      fVar24 = ((fVar29 - fVar17) - (float)local_e8._0_4_ * 0.5) / (1.0 - (float)local_e8._0_4_);
      fVar17 = 1.0;
      if (fVar24 <= 1.0) {
        fVar17 = fVar24;
      }
      fVar17 = (float)(int)((float)(~-(uint)(fVar24 < 0.0) & (uint)fVar17) * (float)local_88._0_4_ +
                           0.5);
      if (axis == ImGuiAxis_X) {
        pfVar9 = (float *)local_f8._0_8_;
      }
      *pfVar9 = fVar17;
      fVar17 = fVar17 / (float)local_88._0_4_;
      fVar24 = 1.0;
      if (fVar17 <= 1.0) {
        fVar24 = fVar17;
      }
      local_108._0_4_ = (local_b8 * (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar24)) / local_a8;
      local_108._4_4_ = fStack_b4;
      fStack_100 = fStack_b0;
      fStack_fc = fStack_ac;
      if (bVar4) {
        (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2] =
             -(float)local_e8._0_4_ * 0.5 + (fVar29 - (float)local_108._0_4_);
      }
    }
    idx = 0x11;
    if (local_11e == false) {
      idx = (local_11d & 1) + 0xf;
    }
    IVar6 = GetColorU32(idx,(float)local_98._0_4_);
    if (axis == ImGuiAxis_X) {
      local_40.x = (float)local_118._0_4_ +
                   (IStack_110.x - (float)local_118._0_4_) * (float)local_108._0_4_;
      local_38.x = (float)local_d8 + local_40.x;
      local_38.y = IStack_110.y;
      local_40.y = (float)local_118._4_4_;
      if ((float)local_78._0_4_ <= (float)local_d8 + local_40.x) {
        local_38.x = (float)local_78._0_4_;
      }
    }
    else {
      local_40.y = (IStack_110.y - (float)local_118._4_4_) * (float)local_108._0_4_ +
                   (float)local_118._4_4_;
      local_38.y = (float)local_d8 + local_40.y;
      local_38.x = IStack_110.x;
      local_40.x = (float)local_118._0_4_;
      if ((float)local_68._0_4_ <= local_38.y) {
        local_38.y = (float)local_68._0_4_;
      }
    }
    ImDrawList::AddRectFilled
              (this->DrawList,&local_40,&local_38,IVar6,(pIVar3->Style).ScrollbarRounding,0xf);
    return;
  }
  __assert_fail("ImMax(win_size_contents_v, win_size_avail_v) > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_widgets.cpp"
                ,0x342,"void ImGui::Scrollbar(ImGuiAxis)");
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const bool horizontal = (axis == ImGuiAxis_X);
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetScrollbarID(window, axis);
    KeepAliveID(id);

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect host_rect = window->Rect();
    const float border_size = window->WindowBorderSize;
    ImRect bb = horizontal
        ? ImRect(host_rect.Min.x + border_size, host_rect.Max.y - style.ScrollbarSize, host_rect.Max.x - other_scrollbar_size_w - border_size, host_rect.Max.y - border_size)
        : ImRect(host_rect.Max.x - style.ScrollbarSize, host_rect.Min.y + border_size, host_rect.Max.x - border_size, host_rect.Max.y - other_scrollbar_size_w - border_size);
    bb.Min.x = ImMax(host_rect.Min.x, bb.Min.x); // Handle case where the host rectangle is smaller than the scrollbar
    bb.Min.y = ImMax(host_rect.Min.y, bb.Min.y);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f); // FIXME: InnerRect?

    const float bb_width = bb.GetWidth();
    const float bb_height = bb.GetHeight();
    if (bb_width <= 0.0f || bb_height <= 0.0f)
        return;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
    {
        alpha = ImSaturate((bb_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
        if (alpha <= 0.0f)
            return;
    }
    const bool allow_interaction = (alpha >= 1.0f);

    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = ImDrawCornerFlags_BotLeft | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0) | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, window_rounding_corners);
    bb.Expand(ImVec2(-ImClamp((float)(int)((bb_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp((float)(int)((bb_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->SizeFull.x : window->SizeFull.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(win_size_contents_v, win_size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(win_size_contents_v, win_size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (win_size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render grab
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImMin(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, host_rect.Max.x), bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImMin(ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels, host_rect.Max.y));
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);
}